

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

void * HTS_calloc(size_t num,size_t size)

{
  void *pvVar1;
  
  if (num * size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = calloc(1,num * size);
    if (pvVar1 == (void *)0x0) {
      pvVar1 = (void *)0x0;
      HTS_error(1,"HTS_calloc: Cannot allocate memory.\n");
    }
  }
  return pvVar1;
}

Assistant:

void *HTS_calloc(const size_t num, const size_t size)
{
   size_t n = num * size;
   void *mem;

   if (n == 0)
      return NULL;

#ifdef FESTIVAL
   mem = (void *) safe_wcalloc(n);
#else
   mem = (void *) malloc(n);
#endif                          /* FESTIVAL */

   memset(mem, 0, n);

   if (mem == NULL)
      HTS_error(1, "HTS_calloc: Cannot allocate memory.\n");

   return mem;
}